

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O0

UBool uset_serializedContains_63(USerializedSet *set,UChar32 c)

{
  int iVar1;
  ushort *puVar2;
  ushort uVar3;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int32_t iabs;
  int32_t i_1;
  int32_t hi_1;
  int32_t lo_1;
  int32_t base;
  uint16_t low;
  uint16_t high;
  int32_t i;
  int32_t hi;
  int32_t lo;
  uint16_t *array;
  UChar32 c_local;
  USerializedSet *set_local;
  
  if ((set == (USerializedSet *)0x0) || (0x10ffff < (uint)c)) {
    set_local._7_1_ = false;
  }
  else {
    puVar2 = set->array;
    if (c < 0x10000) {
      i = 0;
      _low = set->bmpLength + -1;
      if (c < (int)(uint)*puVar2) {
        low._0_1_ = 0;
      }
      else {
        iVar1 = set->bmpLength;
        iVar4 = i;
        if (c < (int)(uint)puVar2[_low]) {
          while (i = iVar4, iVar4 = i + _low >> 1, iVar1 = _low, iVar4 != i) {
            if (c < (int)(uint)puVar2[iVar4]) {
              _low = iVar4;
              iVar4 = i;
            }
          }
        }
        _low = iVar1;
      }
      set_local._7_1_ = (bool)((byte)low & 1);
    }
    else {
      uVar3 = (ushort)((uint)c >> 0x10);
      iVar1 = set->bmpLength;
      i_1 = 0;
      uVar5 = (set->length + -2) - iVar1;
      if ((uVar3 < puVar2[iVar1]) ||
         ((uVar3 == puVar2[iVar1] && ((c & 0xffffU) < (uint)puVar2[iVar1 + 1])))) {
        iabs = 0;
      }
      else if ((uVar3 < puVar2[(int)(iVar1 + uVar5)]) ||
              ((uVar3 == puVar2[(int)(iVar1 + uVar5)] &&
               ((c & 0xffffU) < (uint)puVar2[(int)(iVar1 + uVar5 + 1)])))) {
        while( true ) {
          iabs = uVar5;
          uVar6 = i_1 + iabs >> 1 & 0xfffffffe;
          iVar7 = uVar6 + iVar1;
          if (uVar6 == i_1) break;
          uVar5 = uVar6;
          if ((puVar2[iVar7] <= uVar3) &&
             ((uVar3 != puVar2[iVar7] || ((uint)puVar2[iVar7 + 1] <= (c & 0xffffU))))) {
            uVar5 = iabs;
            i_1 = uVar6;
          }
        }
      }
      else {
        iabs = uVar5 + 2;
      }
      set_local._7_1_ = (iabs + iVar1 * 2 & 2U) != 0;
    }
  }
  return set_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_serializedContains(const USerializedSet* set, UChar32 c) {
    const uint16_t* array;

    if(set==NULL || (uint32_t)c>0x10ffff) {
        return FALSE;
    }

    array=set->array;
    if(c<=0xffff) {
        /* find c in the BMP part */
        int32_t lo = 0;
        int32_t hi = set->bmpLength-1;
        if (c < array[0]) {
            hi = 0;
        } else if (c < array[hi]) {
            for(;;) {
                int32_t i = (lo + hi) >> 1;
                if (i == lo) {
                    break;  // Done!
                } else if (c < array[i]) {
                    hi = i;
                } else {
                    lo = i;
                }
            }
        } else {
            hi += 1;
        }
        return (UBool)(hi&1);
    } else {
        /* find c in the supplementary part */
        uint16_t high=(uint16_t)(c>>16), low=(uint16_t)c;
        int32_t base = set->bmpLength;
        int32_t lo = 0;
        int32_t hi = set->length - 2 - base;
        if (high < array[base] || (high==array[base] && low<array[base+1])) {
            hi = 0;
        } else if (high < array[base+hi] || (high==array[base+hi] && low<array[base+hi+1])) {
            for (;;) {
                int32_t i = ((lo + hi) >> 1) & ~1;  // Guarantee even result
                int32_t iabs = i + base;
                if (i == lo) {
                    break;  // Done!
                } else if (high < array[iabs] || (high==array[iabs] && low<array[iabs+1])) {
                    hi = i;
                } else {
                    lo = i;
                }
            }
        } else {
            hi += 2;
        }
        /* count pairs of 16-bit units even per BMP and check if the number of pairs is odd */
        return (UBool)(((hi+(base<<1))&2)!=0);
    }
}